

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturing.hpp
# Opt level: O3

Vector3<float> __thiscall
eos::render::detail::tex2d_linear<float>
          (detail *this,Vector2<float> *imageTexCoord,uchar mipmap_index,Texture *texture)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uchar uVar11;
  pointer pIVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  int x;
  uint uVar17;
  long lVar18;
  undefined1 auVar19 [14];
  unkint10 Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [12];
  Pixel<unsigned_char,_4> *pPVar30;
  uint uVar31;
  uint uVar32;
  undefined7 in_register_00000011;
  int y;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 extraout_XMM0_Ba;
  undefined1 uVar36;
  undefined1 extraout_XMM0_Bb;
  undefined1 uVar37;
  undefined1 extraout_XMM0_Bc;
  undefined1 uVar38;
  undefined1 extraout_XMM0_Bd;
  undefined1 uVar39;
  undefined1 extraout_XMM0_Be;
  undefined1 uVar40;
  undefined1 extraout_XMM0_Be_00;
  undefined1 extraout_XMM0_Bf;
  undefined1 uVar41;
  undefined1 extraout_XMM0_Bf_00;
  undefined1 extraout_XMM0_Bg;
  undefined1 uVar42;
  undefined1 extraout_XMM0_Bg_00;
  undefined1 extraout_XMM0_Bh;
  undefined1 uVar43;
  undefined1 extraout_XMM0_Bh_00;
  undefined2 uVar97;
  undefined2 uVar98;
  undefined2 uVar99;
  undefined2 uVar100;
  undefined1 auVar53 [16];
  undefined1 auVar65 [16];
  undefined1 auVar77 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  Vector3<float> VVar96;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar54 [16];
  undefined1 auVar66 [16];
  undefined1 auVar78 [16];
  undefined1 auVar89 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar55 [16];
  undefined1 auVar67 [16];
  undefined1 auVar79 [16];
  undefined1 auVar90 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar52 [16];
  undefined1 auVar64 [16];
  undefined1 auVar76 [16];
  undefined1 auVar87 [16];
  undefined1 auVar44 [16];
  undefined1 auVar56 [16];
  undefined1 auVar68 [16];
  undefined1 auVar80 [16];
  
  uVar1 = *(undefined8 *)
           (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array;
  fVar94 = (float)uVar1;
  fVar95 = (float)((ulong)uVar1 >> 0x20);
  x = (int)fVar94;
  iVar35 = (int)fVar95;
  fVar94 = fVar94 - (float)x;
  fVar95 = fVar95 - (float)iVar35;
  fVar93 = (1.0 - fVar94) * (1.0 - fVar95);
  fVar92 = (1.0 - fVar95) * fVar94;
  pIVar12 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (ulong)(uint)((int)CONCAT71(in_register_00000011,mipmap_index) << 3) * 5;
  fVar91 = (1.0 - fVar94) * fVar95;
  iVar33 = x;
  if (*(int *)((long)&pIVar12->width_ + lVar18) == x) {
    iVar33 = 0;
  }
  iVar34 = iVar35;
  if (*(int *)((long)&pIVar12->height_ + lVar18) == iVar35) {
    iVar34 = 0;
  }
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar12->height_ + lVar18),iVar34,iVar33);
  bVar2 = (pPVar30->data_)._M_elems[0];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar34
                       ,iVar33);
  bVar3 = (pPVar30->data_)._M_elems[1];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar34
                       ,iVar33);
  bVar4 = (pPVar30->data_)._M_elems[2];
  iVar34 = x + 1;
  pIVar12 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar33 = iVar34;
  if (iVar34 == *(int *)((long)&pIVar12->width_ + lVar18)) {
    iVar33 = 0;
  }
  y = iVar35;
  if (*(int *)((long)&pIVar12->height_ + lVar18) == iVar35) {
    y = 0;
  }
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar12->height_ + lVar18),y,iVar33);
  bVar5 = (pPVar30->data_)._M_elems[0];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),y,
                       iVar33);
  bVar6 = (pPVar30->data_)._M_elems[1];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),y,
                       iVar33);
  bVar7 = (pPVar30->data_)._M_elems[2];
  pIVar12 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(int *)((long)&pIVar12->width_ + lVar18) == x) {
    x = 0;
  }
  iVar35 = iVar35 + 1;
  iVar33 = iVar35;
  if (iVar35 == *(int *)((long)&pIVar12->height_ + lVar18)) {
    iVar33 = 0;
  }
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar12->height_ + lVar18),iVar33,x);
  bVar8 = (pPVar30->data_)._M_elems[0];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar33
                       ,x);
  bVar9 = (pPVar30->data_)._M_elems[1];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar33
                       ,x);
  bVar10 = (pPVar30->data_)._M_elems[2];
  pIVar12 = (texture->mipmaps).
            super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (iVar34 == *(int *)((long)&pIVar12->width_ + lVar18)) {
    iVar34 = 0;
  }
  if (iVar35 == *(int *)((long)&pIVar12->height_ + lVar18)) {
    iVar35 = 0;
  }
  fVar95 = fVar95 * fVar94;
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&pIVar12->height_ + lVar18),iVar35,iVar34);
  uVar11 = (pPVar30->data_)._M_elems[0];
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar35
                       ,iVar34);
  uVar31 = (uint)bVar3 * 0x100 + (uint)bVar2;
  uVar32 = CONCAT13(extraout_XMM0_Bd,
                    CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
           CONCAT13(extraout_XMM0_Bd,
                    CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)));
  uVar36 = (undefined1)uVar32;
  uVar37 = (undefined1)(uVar32 >> 8);
  uVar38 = (undefined1)(uVar32 >> 0x10);
  uVar39 = (undefined1)(uVar32 >> 0x18);
  uVar17 = CONCAT13(extraout_XMM0_Bh,
                    CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
           CONCAT13(extraout_XMM0_Bh,
                    CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
  uVar40 = (undefined1)uVar17;
  uVar41 = (undefined1)(uVar17 >> 8);
  uVar42 = (undefined1)(uVar17 >> 0x10);
  uVar43 = (undefined1)(uVar17 >> 0x18);
  auVar52._0_15_ = ZEXT415(uVar31);
  auVar52[0xf] = uVar43;
  auVar51._14_2_ = auVar52._14_2_;
  auVar51._0_13_ = ZEXT413(uVar31);
  auVar51[0xd] = uVar42;
  auVar50._13_3_ = auVar51._13_3_;
  auVar50._0_13_ = ZEXT413(uVar31);
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._4_7_ = 0;
  auVar49._0_4_ = uVar31;
  auVar49[0xb] = uVar41;
  auVar48._11_5_ = auVar49._11_5_;
  auVar48._4_7_ = 0;
  auVar48._0_4_ = uVar31;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._4_5_ = 0;
  auVar47._0_4_ = uVar31;
  auVar47[9] = uVar40;
  auVar46._9_7_ = auVar47._9_7_;
  auVar46._4_5_ = 0;
  auVar46._0_4_ = uVar31;
  Var20 = (unkuint10)CONCAT81(auVar46._8_8_,uVar39) << 8;
  auVar45._6_10_ = Var20;
  auVar45[5] = uVar38;
  auVar45[4] = (char)(uVar31 >> 0x10);
  auVar45._0_4_ = uVar31;
  auVar19._2_12_ = auVar45._4_12_;
  auVar19[1] = uVar37;
  auVar19[0] = (char)(uVar31 >> 8);
  uVar97 = CONCAT11(uVar36,(char)uVar31);
  auVar44._2_14_ = auVar19;
  uVar16 = (undefined2)(uVar17 >> 0x10);
  auVar55._0_12_ = auVar44._0_12_;
  auVar55._12_2_ = (short)Var20;
  auVar55._14_2_ = uVar16;
  uVar15 = (undefined2)uVar17;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = auVar44._0_10_;
  auVar54._10_2_ = uVar15;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = auVar44._0_8_;
  auVar53._8_2_ = auVar45._4_2_;
  uVar14 = (undefined2)(uVar32 >> 0x10);
  auVar21._4_8_ = auVar53._8_8_;
  auVar21._2_2_ = uVar14;
  auVar21._0_2_ = auVar19._0_2_;
  uVar13 = (undefined2)uVar32;
  uVar32 = (uint)bVar6 * 0x100 + (uint)bVar5;
  auVar64._0_15_ = ZEXT415(uVar32);
  auVar64[0xf] = uVar43;
  auVar63._14_2_ = auVar64._14_2_;
  auVar63._0_13_ = ZEXT413(uVar32);
  auVar63[0xd] = uVar42;
  auVar62._13_3_ = auVar63._13_3_;
  auVar62._0_13_ = ZEXT413(uVar32);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._4_7_ = 0;
  auVar61._0_4_ = uVar32;
  auVar61[0xb] = uVar41;
  auVar60._11_5_ = auVar61._11_5_;
  auVar60._4_7_ = 0;
  auVar60._0_4_ = uVar32;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._4_5_ = 0;
  auVar59._0_4_ = uVar32;
  auVar59[9] = uVar40;
  auVar58._9_7_ = auVar59._9_7_;
  auVar58._4_5_ = 0;
  auVar58._0_4_ = uVar32;
  Var20 = (unkuint10)CONCAT81(auVar58._8_8_,uVar39) << 8;
  auVar57._6_10_ = Var20;
  auVar57[5] = uVar38;
  auVar57[4] = (char)(uVar32 >> 0x10);
  auVar57._0_4_ = uVar32;
  auVar22._2_12_ = auVar57._4_12_;
  auVar22[1] = uVar37;
  auVar22[0] = (char)(uVar32 >> 8);
  uVar98 = CONCAT11(uVar36,(char)uVar32);
  auVar56._2_14_ = auVar22;
  auVar67._0_12_ = auVar56._0_12_;
  auVar67._12_2_ = (short)Var20;
  auVar67._14_2_ = uVar16;
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._0_10_ = auVar56._0_10_;
  auVar66._10_2_ = uVar15;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._0_8_ = auVar56._0_8_;
  auVar65._8_2_ = auVar57._4_2_;
  auVar23._4_8_ = auVar65._8_8_;
  auVar23._2_2_ = uVar14;
  auVar23._0_2_ = auVar22._0_2_;
  uVar32 = (uint)bVar9 * 0x100 + (uint)bVar8;
  auVar76._0_15_ = ZEXT415(uVar32);
  auVar76[0xf] = uVar43;
  auVar75._14_2_ = auVar76._14_2_;
  auVar75._0_13_ = ZEXT413(uVar32);
  auVar75[0xd] = uVar42;
  auVar74._13_3_ = auVar75._13_3_;
  auVar74._0_13_ = ZEXT413(uVar32);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._4_7_ = 0;
  auVar73._0_4_ = uVar32;
  auVar73[0xb] = uVar41;
  auVar72._11_5_ = auVar73._11_5_;
  auVar72._4_7_ = 0;
  auVar72._0_4_ = uVar32;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._4_5_ = 0;
  auVar71._0_4_ = uVar32;
  auVar71[9] = uVar40;
  auVar70._9_7_ = auVar71._9_7_;
  auVar70._4_5_ = 0;
  auVar70._0_4_ = uVar32;
  Var20 = (unkuint10)CONCAT81(auVar70._8_8_,uVar39) << 8;
  auVar69._6_10_ = Var20;
  auVar69[5] = uVar38;
  auVar69[4] = (char)(uVar32 >> 0x10);
  auVar69._0_4_ = uVar32;
  auVar24._2_12_ = auVar69._4_12_;
  auVar24[1] = uVar37;
  auVar24[0] = (char)(uVar32 >> 8);
  uVar99 = CONCAT11(uVar36,(char)uVar32);
  auVar68._2_14_ = auVar24;
  auVar79._0_12_ = auVar68._0_12_;
  auVar79._12_2_ = (short)Var20;
  auVar79._14_2_ = uVar16;
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._0_10_ = auVar68._0_10_;
  auVar78._10_2_ = uVar15;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._0_8_ = auVar68._0_8_;
  auVar77._8_2_ = auVar69._4_2_;
  auVar25._4_8_ = auVar77._8_8_;
  auVar25._2_2_ = uVar14;
  auVar25._0_2_ = auVar24._0_2_;
  auVar87._0_15_ = ZEXT415(0);
  auVar87[0xf] = uVar43;
  auVar86._14_2_ = auVar87._14_2_;
  auVar86._0_13_ = ZEXT413(0);
  auVar86[0xd] = uVar42;
  auVar85._13_3_ = auVar86._13_3_;
  auVar85._0_13_ = ZEXT413(0);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._0_11_ = ZEXT411(0);
  auVar84[0xb] = uVar41;
  auVar83._11_5_ = auVar84._11_5_;
  auVar83._0_11_ = ZEXT411(0);
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_9_ = (unkuint9)0;
  auVar82[9] = uVar40;
  auVar81._9_7_ = auVar82._9_7_;
  auVar81._0_9_ = (unkuint9)0;
  auVar28._1_8_ = auVar81._8_8_;
  auVar28[0] = uVar39;
  auVar28._9_7_ = 0;
  auVar27._1_10_ = SUB1610(auVar28 << 0x38,6);
  auVar27[0] = uVar38;
  auVar27._11_5_ = 0;
  auVar26._2_12_ = SUB1612(auVar27 << 0x28,4);
  auVar26[1] = uVar37;
  auVar26[0] = (pPVar30->data_)._M_elems[1];
  uVar100 = CONCAT11(uVar36,uVar11);
  auVar80._2_14_ = auVar26;
  auVar90._0_12_ = auVar80._0_12_;
  auVar90._12_2_ = SUB162(auVar28 << 0x38,6);
  auVar90._14_2_ = uVar16;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = auVar80._0_10_;
  auVar89._10_2_ = uVar15;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = auVar80._0_8_;
  auVar88._8_2_ = SUB162(auVar27 << 0x28,4);
  auVar29._4_8_ = auVar88._8_8_;
  auVar29._2_2_ = uVar14;
  auVar29._0_2_ = auVar26._0_2_;
  fVar94 = fVar95 * (float)CONCAT22(uVar13,uVar100) +
           fVar91 * (float)CONCAT22(uVar13,uVar99) +
           fVar92 * (float)CONCAT22(uVar13,uVar98) + fVar93 * (float)CONCAT22(uVar13,uVar97);
  *(float *)this = fVar94;
  *(float *)(this + 4) =
       fVar95 * (float)auVar29._0_4_ +
       fVar91 * (float)auVar25._0_4_ + fVar92 * (float)auVar23._0_4_ + fVar93 * (float)auVar21._0_4_
  ;
  pPVar30 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       ((long)&((texture->mipmaps).
                                super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar18),iVar35
                       ,iVar34);
  uVar32 = CONCAT13(extraout_XMM0_Bh_00,
                    CONCAT12(extraout_XMM0_Bg_00,CONCAT11(extraout_XMM0_Bf_00,extraout_XMM0_Be_00)))
           ^ CONCAT13(extraout_XMM0_Bh_00,
                      CONCAT12(extraout_XMM0_Bg_00,CONCAT11(extraout_XMM0_Bf_00,extraout_XMM0_Be_00)
                              ));
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._0_1_
       = (undefined1)uVar32;
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._1_1_
       = (undefined1)(uVar32 >> 8);
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._2_1_
       = (undefined1)(uVar32 >> 0x10);
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._3_1_
       = (undefined1)(uVar32 >> 0x18);
  fVar95 = (float)(pPVar30->data_)._M_elems[2] * fVar95 +
           (float)bVar10 * fVar91 + (float)bVar7 * fVar92 + (float)bVar4 * fVar93;
  *(float *)(this + 8) = fVar95;
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       fVar95;
  VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar94;
  return (Vector3<float>)
         VVar96.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

inline Eigen::Vector3<T> tex2d_linear(const Eigen::Vector2<T>& imageTexCoord, unsigned char mipmap_index,
                                      const Texture& texture)
{
    const int x = (int)imageTexCoord[0];
    const int y = (int)imageTexCoord[1];
    const float alpha = imageTexCoord[0] - x;
    const float beta = imageTexCoord[1] - y;
    const float oneMinusAlpha = 1.0f - alpha;
    const float oneMinusBeta = 1.0f - beta;
    const float a = oneMinusAlpha * oneMinusBeta;
    const float b = alpha * oneMinusBeta;
    const float c = oneMinusAlpha * beta;
    const float d = alpha * beta;
    Eigen::Vector3<T> color;

    // int pixelIndex;
    // pixelIndex = getPixelIndex_wrap(x, y, texture->mipmaps[mipmapIndex].cols,
    // texture->mipmaps[mipmapIndex].rows);
    int pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    int pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    // std::cout << texture.mipmaps[mipmapIndex].cols << " " << texture.mipmaps[mipmapIndex].rows << " " <<
    // texture.mipmaps[mipmapIndex].channels() << std::endl;  cv::imwrite("mm.png",
    // texture.mipmaps[mipmapIndex]);
    color[0] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    return color;
}